

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPService.cpp
# Opt level: O0

void __thiscall brynet::net::TcpService::stopWorkerThread(TcpService *this)

{
  bool bVar1;
  element_type *peVar2;
  __shared_ptr_access<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar3;
  __shared_ptr_access<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *this_02;
  __shared_ptr_access<std::thread,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var4;
  element_type *this_03;
  shared_ptr<brynet::net::IOLoopData> *v;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
  *__range1;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  lock_guard<std::mutex> lck;
  TcpService *this_local;
  
  std::lock_guard<std::mutex>::lock_guard(&lock,&this->mServiceGuard);
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mIOLoopGuard);
  peVar2 = std::__shared_ptr_access<bool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<bool,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->mRunIOLoop);
  *peVar2 = false;
  __end1 = std::
           vector<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
           ::begin(&this->mIOLoopDatas);
  v = (shared_ptr<brynet::net::IOLoopData> *)
      std::
      vector<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
      ::end(&this->mIOLoopDatas);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::shared_ptr<brynet::net::IOLoopData>_*,_std::vector<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>_>
                                     *)&v), bVar1) {
    this_00 = (__shared_ptr_access<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)__gnu_cxx::
                 __normal_iterator<std::shared_ptr<brynet::net::IOLoopData>_*,_std::vector<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>_>
                 ::operator*(&__end1);
    peVar3 = std::
             __shared_ptr_access<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(this_00);
    this_01 = (__shared_ptr_access<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)IOLoopData::getEventLoop(peVar3);
    this_02 = std::
              __shared_ptr_access<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->(this_01);
    EventLoop::wakeup(this_02);
    peVar3 = std::
             __shared_ptr_access<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(this_00);
    p_Var4 = (__shared_ptr_access<std::thread,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             IOLoopData::getIOThread(peVar3);
    this_03 = std::__shared_ptr_access<std::thread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->(p_Var4);
    bVar1 = std::thread::joinable(this_03);
    if (bVar1) {
      peVar3 = std::
               __shared_ptr_access<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(this_00);
      p_Var4 = (__shared_ptr_access<std::thread,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               IOLoopData::getIOThread(peVar3);
      std::__shared_ptr_access<std::thread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                (p_Var4);
      std::thread::join();
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<brynet::net::IOLoopData>_*,_std::vector<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
  ::clear(&this->mIOLoopDatas);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  std::lock_guard<std::mutex>::~lock_guard(&lock);
  return;
}

Assistant:

void TcpService::stopWorkerThread()
{
    std::lock_guard<std::mutex> lck(mServiceGuard);
    std::lock_guard<std::mutex> lock(mIOLoopGuard);

    *mRunIOLoop = false;

    for (const auto& v : mIOLoopDatas)
    {
        v->getEventLoop()->wakeup();
        try
        {
            if (v->getIOThread()->joinable())
            {
                v->getIOThread()->join();
            }
        }
        catch (...)
        {
        }
    }
    mIOLoopDatas.clear();
}